

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265d_ps.c
# Opt level: O3

int scaling_list_data(HEVCContext *s,ScalingList *sl,HEVCSPS *sps)

{
  RK_U8 *pRVar1;
  byte bVar2;
  undefined2 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  MPP_RET MVar11;
  uint uVar12;
  RK_U8 *pRVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  int iVar18;
  RK_S32 _out;
  RK_U32 local_84;
  ulong local_80;
  RK_U8 (*local_78) [6];
  ulong local_70;
  HEVCSPS *local_68;
  RK_U8 (*local_60) [6];
  RK_U8 (*local_58) [6] [64];
  size_t local_50;
  ScalingList *local_48;
  long local_40;
  ulong local_38;
  
  local_60 = sl->sl_dc;
  uVar16 = 0;
  local_68 = sps;
  local_48 = sl;
  do {
    uVar17 = 0x10 << ((char)uVar16 * '\x02' & 0x1fU);
    if (0x3f < uVar17) {
      uVar17 = 0x40;
    }
    local_70 = (ulong)((uint)(uVar16 == 3) * 2 + 1);
    local_50 = 0x40;
    if (uVar16 == 0) {
      local_50 = 0x10;
    }
    local_38 = (ulong)(uVar17 + (uVar17 == 0));
    local_40 = uVar16 * 0x180;
    local_58 = sl->sl + uVar16;
    local_78 = local_60 + (uVar16 - 2);
    uVar15 = 0;
    do {
      MVar11 = mpp_read_bits((BitReadCtx_t *)s,1,(RK_S32 *)&local_84);
      *(MPP_RET *)((long)s->vps_list + 0x14) = MVar11;
      if (MVar11 != MPP_OK) {
        return -0x3ec;
      }
      local_80 = uVar15;
      if ((char)local_84 == '\0') {
        MVar11 = mpp_read_ue((BitReadCtx_t *)s,&local_84);
        *(MPP_RET *)((long)s->vps_list + 0x14) = MVar11;
        if (MVar11 != MPP_OK) {
          return -0x3ec;
        }
        if (local_84 != 0) {
          if (local_80 < local_84 * (int)local_70) {
            _mpp_log_l(2,"H265PARSER_PS","Invalid delta in scaling list data: %d.\n",(char *)0x0);
            return -0x3ec;
          }
          uVar17 = (int)local_80 - local_84 * (int)local_70;
          memcpy(*local_58 + local_80,*local_58 + uVar17,local_50);
          if (1 < uVar16) {
            (*local_78)[local_80] = (*local_78)[uVar17];
          }
        }
      }
      else {
        iVar18 = 8;
        if (1 < uVar16) {
          MVar11 = mpp_read_se((BitReadCtx_t *)s,(RK_S32 *)&local_84);
          *(MPP_RET *)((long)s->vps_list + 0x14) = MVar11;
          if (MVar11 != MPP_OK) {
            return -0x3ec;
          }
          iVar18 = local_84 + 8;
          (*local_78)[uVar15] = (RK_U8)iVar18;
        }
        uVar15 = 0;
        do {
          if (uVar16 == 0) {
            lVar14 = (ulong)""[uVar15] << 2;
            pRVar13 = "";
          }
          else {
            lVar14 = (ulong)""[uVar15] << 3;
            pRVar13 = "";
          }
          bVar2 = pRVar13[uVar15];
          MVar11 = mpp_read_se((BitReadCtx_t *)s,(RK_S32 *)&local_84);
          *(MPP_RET *)((long)s->vps_list + 0x14) = MVar11;
          if (MVar11 != MPP_OK) {
            return -0x3ec;
          }
          uVar12 = local_84 + iVar18 + 0x100;
          uVar17 = iVar18 + local_84 + 0x1ff;
          if (-1 < (int)uVar12) {
            uVar17 = uVar12;
          }
          iVar18 = uVar12 - (uVar17 & 0xffffff00);
          local_48->sl[0][local_80][lVar14 + (ulong)bVar2 + local_40] = (RK_U8)iVar18;
          uVar15 = uVar15 + 1;
          sl = local_48;
        } while (local_38 != uVar15);
      }
      uVar15 = local_80 + local_70;
    } while (uVar15 < 6);
    uVar16 = uVar16 + 1;
    if (uVar16 == 4) {
      if (local_68->chroma_format_idc == 3) {
        lVar14 = -0x40;
        do {
          pRVar13 = sl->sl[2][2] + lVar14;
          uVar4 = *(undefined8 *)(pRVar13 + 8);
          pRVar1 = sl->sl[2][3] + lVar14;
          uVar5 = *(undefined8 *)pRVar1;
          uVar6 = *(undefined8 *)(pRVar1 + 8);
          pRVar1 = sl->sl[2][5] + lVar14;
          uVar7 = *(undefined8 *)pRVar1;
          uVar8 = *(undefined8 *)(pRVar1 + 8);
          pRVar1 = sl->sl[3][0] + lVar14;
          uVar9 = *(undefined8 *)pRVar1;
          uVar10 = *(undefined8 *)(pRVar1 + 8);
          pRVar1 = sl->sl[3][2] + lVar14;
          *(undefined8 *)pRVar1 = *(undefined8 *)pRVar13;
          *(undefined8 *)(pRVar1 + 8) = uVar4;
          pRVar13 = sl->sl[3][3] + lVar14;
          *(undefined8 *)pRVar13 = uVar5;
          *(undefined8 *)(pRVar13 + 8) = uVar6;
          *(undefined8 *)((long)(sl->sl_dc + -0xb) + lVar14 + 2) = uVar7;
          *(undefined8 *)((RK_U8 *)((long)(sl->sl_dc + -0xb) + lVar14 + 2) + 8) = uVar8;
          pRVar13 = sl->sl_dc[0] + lVar14;
          *(undefined8 *)pRVar13 = uVar9;
          *(undefined8 *)(pRVar13 + 8) = uVar10;
          lVar14 = lVar14 + 0x10;
        } while (lVar14 != 0);
        uVar3 = *(undefined2 *)(sl->sl_dc[0] + 4);
        *(undefined2 *)(sl->sl_dc[1] + 1) = *(undefined2 *)(sl->sl_dc[0] + 1);
        *(undefined2 *)(sl->sl_dc[1] + 4) = uVar3;
      }
      return 0;
    }
  } while( true );
}

Assistant:

static int scaling_list_data(HEVCContext *s, ScalingList *sl, HEVCSPS *sps)
{
    BitReadCtx_t *gb = &s->HEVClc->gb;
    RK_U8 scaling_list_pred_mode_flag;
    RK_S32 scaling_list_dc_coef[2][6];
    RK_S32 size_id,  i, pos;
    RK_U32 matrix_id;

    for (size_id = 0; size_id < 4; size_id++)
        for (matrix_id = 0; matrix_id < 6; matrix_id += ((size_id == 3) ? 3 : 1)) {
            READ_ONEBIT(gb, &scaling_list_pred_mode_flag);
            if (!scaling_list_pred_mode_flag) {
                RK_U32 delta = 0;
                READ_UE(gb, &delta);
                /* Only need to handle non-zero delta. Zero means default,
                 * which should already be in the arrays. */
                if (delta) {
                    // Copy from previous array.
                    delta *= (size_id == 3) ? 3 : 1;
                    if (matrix_id < delta) {
                        mpp_err(
                            "Invalid delta in scaling list data: %d.\n", delta);
                        return  MPP_ERR_STREAM;
                    }

                    memcpy(sl->sl[size_id][matrix_id],
                           sl->sl[size_id][matrix_id - delta],
                           size_id > 0 ? 64 : 16);
                    if (size_id > 1)
                        sl->sl_dc[size_id - 2][matrix_id] = sl->sl_dc[size_id - 2][matrix_id - delta];
                }
            } else {
                RK_S32 next_coef, coef_num;
                RK_S32 scaling_list_delta_coef;

                next_coef = 8;
                coef_num  = MPP_MIN(64, 1 << (4 + (size_id << 1)));
                if (size_id > 1) {
                    READ_SE(gb, &scaling_list_dc_coef[size_id - 2][matrix_id]);
                    scaling_list_dc_coef[size_id - 2][matrix_id] =  scaling_list_dc_coef[size_id - 2][matrix_id] + 8;
                    next_coef = scaling_list_dc_coef[size_id - 2][matrix_id];
                    sl->sl_dc[size_id - 2][matrix_id] = next_coef;
                }
                for (i = 0; i < coef_num; i++) {
                    if (size_id == 0)
                        pos = 4 * mpp_hevc_diag_scan4x4_y[i] +
                              mpp_hevc_diag_scan4x4_x[i];
                    else
                        pos = 8 * mpp_hevc_diag_scan8x8_y[i] +
                              mpp_hevc_diag_scan8x8_x[i];

                    READ_SE(gb, &scaling_list_delta_coef);
                    next_coef = (next_coef + scaling_list_delta_coef + 256) % 256;
                    sl->sl[size_id][matrix_id][pos] = next_coef;
                }
            }
        }
    if (sps->chroma_format_idc == H265_CHROMA_444) {
        for (i = 0; i < 64; i++) {
            sl->sl[3][1][i] = sl->sl[2][1][i];
            sl->sl[3][2][i] = sl->sl[2][2][i];
            sl->sl[3][4][i] = sl->sl[2][4][i];
            sl->sl[3][5][i] = sl->sl[2][5][i];
        }
        sl->sl_dc[1][1] = sl->sl_dc[0][1];
        sl->sl_dc[1][2] = sl->sl_dc[0][2];
        sl->sl_dc[1][4] = sl->sl_dc[0][4];
        sl->sl_dc[1][5] = sl->sl_dc[0][5];
    }
    return 0;
__BITREAD_ERR:
    return  MPP_ERR_STREAM;
}